

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  _Ios_Iostate __a;
  _Ios_Openmode _Var6;
  uint uVar7;
  undefined8 uVar8;
  int *piVar9;
  long *plVar10;
  size_t *psVar11;
  int in_ECX;
  char *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  ImageU8 imageu8;
  failure *ex;
  store_t_conflict1 v_1;
  long i_2;
  long k_1;
  streambuf *sb_1;
  long i_1;
  long j;
  store_t_conflict1 v;
  int ii;
  long i;
  long j_1;
  streambuf *sb;
  long kk;
  long k;
  valarray<int> nline;
  valarray<int> vline;
  ifstream in;
  bool msbfirst;
  int type;
  long height;
  long width;
  string filename;
  int *in_stack_fffffffffffffa38;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  string *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  int iVar12;
  long in_stack_fffffffffffffa88;
  long in_stack_fffffffffffffa90;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this_00;
  long in_stack_fffffffffffffa98;
  long i_00;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffffaa0;
  long k_00;
  undefined1 local_478 [110];
  ushort local_40a;
  long local_408;
  long local_400;
  undefined8 local_3f8;
  long local_3f0 [3];
  long local_3d8 [3];
  ushort local_3be;
  int local_3bc;
  long local_3b8 [3];
  long local_3a0 [3];
  undefined8 local_388;
  long local_380;
  undefined8 local_378;
  undefined8 local_370;
  long local_368;
  undefined4 local_360;
  undefined4 local_35c;
  long local_358 [3];
  undefined4 local_33c;
  valarray<int> local_338;
  undefined4 local_324;
  valarray<int> local_320;
  long local_310 [13];
  long *in_stack_fffffffffffffd58;
  long *in_stack_fffffffffffffd60;
  bool *in_stack_fffffffffffffd68;
  int *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int local_104;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [115];
  byte local_65;
  int local_64;
  long local_60;
  long local_58;
  string local_50 [32];
  long local_30;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_50);
  bVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,1);
  if ((bVar1 & 1) == 0) {
    local_da = 1;
    uVar8 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,local_18,&local_d9);
    std::operator+((char *)in_stack_fffffffffffffa48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa40);
    std::operator+(in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa78);
    local_da = 0;
    __cxa_throw(uVar8,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::__cxx11::string::operator=(local_50,local_100);
  std::__cxx11::string::~string(local_100);
  if (local_64 < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              (in_stack_fffffffffffffa50,(long)in_stack_fffffffffffffa48,
               (long)in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
    (**(code **)(*in_RDI + 0x30))
              (in_RDI,local_478,local_18,local_1c,local_28,local_30,in_stack_00000008,
               in_stack_00000010);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(in_stack_fffffffffffffa50);
  }
  else {
    local_104 = 1;
    piVar9 = std::max<int>(&local_104,&local_1c);
    local_1c = *piVar9;
    if (in_stack_00000008 < 0) {
      in_stack_00000008 = (local_58 + local_1c + -1) / (long)local_1c;
    }
    if (in_stack_00000010 < 0) {
      in_stack_00000010 = (local_60 + local_1c + -1) / (long)local_1c;
    }
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa88);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::clear
              ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    std::ifstream::ifstream(local_310);
    uVar8 = *(undefined8 *)(local_310[0] + -0x18);
    __a = std::operator|(_S_failbit,_S_badbit);
    std::operator|(__a,_S_eofbit);
    std::ios::exceptions((int)local_310 + (int)uVar8);
    _Var6 = std::__cxx11::string::c_str();
    std::ifstream::open((char *)local_310,_Var6);
    if ((((local_1c < 2) && (local_28 == 0)) && (local_30 == 0)) &&
       ((in_stack_00000008 == local_58 && (in_stack_00000010 == local_60)))) {
      local_3f8 = std::ifstream::rdbuf();
      for (local_400 = 0; local_400 < local_60; local_400 = local_400 + 1) {
        for (local_408 = 0; local_408 < local_58; local_408 = local_408 + 1) {
          if ((local_65 & 1) == 0) {
            local_40a = std::streambuf::sbumpc();
            local_40a = local_40a & 0xff;
            sVar5 = std::streambuf::sbumpc();
            local_40a = local_40a | sVar5 << 8;
          }
          else {
            local_40a = std::streambuf::sbumpc();
            local_40a = local_40a & 0xff;
            uVar4 = local_40a << 8;
            uVar3 = std::streambuf::sbumpc();
            local_40a = uVar4 | uVar3 & 0xff;
          }
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                    (local_10,local_408,local_400,0,local_40a);
        }
      }
    }
    else {
      local_324 = 0;
      std::valarray<int>::valarray
                ((valarray<int> *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48,
                 (size_t)in_stack_fffffffffffffa40);
      local_33c = 0;
      std::valarray<int>::valarray
                ((valarray<int> *)in_stack_fffffffffffffa50,(int *)in_stack_fffffffffffffa48,
                 (size_t)in_stack_fffffffffffffa40);
      local_358[1] = 0;
      local_358[0] = -local_30;
      plVar10 = std::max<long>(local_358 + 1,local_358);
      for (local_358[2] = *plVar10;
          local_358[2] < in_stack_00000010 && (local_30 + local_358[2]) * (long)local_1c < local_60;
          local_358[2] = local_358[2] + 1) {
        local_35c = 0;
        std::valarray<int>::operator=
                  ((valarray<int> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
        local_360 = 0;
        std::valarray<int>::operator=
                  ((valarray<int> *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
        local_368 = 0;
        while( true ) {
          bVar2 = false;
          if (local_368 < local_1c) {
            bVar2 = local_368 + (local_30 + local_358[2]) * (long)local_1c < local_60;
          }
          if (!bVar2) break;
          local_380 = 0;
          std::max<long>(&local_380,&local_28);
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_fffffffffffffa40,
                     (streamoff)in_stack_fffffffffffffa38);
          std::istream::seekg(local_310,local_378,local_370);
          local_388 = std::ifstream::rdbuf();
          local_3a0[1] = 0;
          local_3a0[0] = -local_28;
          psVar11 = (size_t *)std::max<long>(local_3a0 + 1,local_3a0);
          local_3a0[2] = *psVar11;
          local_3b8[1] = 0;
          local_3b8[0] = -local_28;
          plVar10 = std::max<long>(local_3b8 + 1,local_3b8);
          for (local_3b8[2] = *plVar10;
              local_3b8[2] < in_stack_00000008 &&
              (local_28 + local_3b8[2]) * (long)local_1c < local_58; local_3b8[2] = local_3b8[2] + 1
              ) {
            local_3bc = 0;
            while( true ) {
              bVar2 = false;
              if (local_3bc < local_1c) {
                bVar2 = (local_28 + local_3b8[2]) * (long)local_1c + (long)local_3bc < local_58;
              }
              if (!bVar2) break;
              if ((local_65 & 1) == 0) {
                uVar4 = std::streambuf::sbumpc();
                local_3be = uVar4 & 0xff;
                sVar5 = std::streambuf::sbumpc();
                local_3be = uVar4 & 0xff | sVar5 << 8;
              }
              else {
                local_3be = std::streambuf::sbumpc();
                local_3be = local_3be & 0xff;
                uVar4 = local_3be << 8;
                uVar3 = std::streambuf::sbumpc();
                local_3be = uVar4 | uVar3 & 0xff;
              }
              bVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValidS
                                (in_stack_fffffffffffffa40,
                                 (store_t_conflict1)((ulong)in_stack_fffffffffffffa38 >> 0x30));
              if (bVar2) {
                uVar7 = (uint)local_3be;
                piVar9 = std::valarray<int>::operator[](&local_320,local_3a0[2]);
                *piVar9 = *piVar9 + uVar7;
                piVar9 = std::valarray<int>::operator[](&local_338,local_3a0[2]);
                *piVar9 = *piVar9 + 1;
              }
              local_3bc = local_3bc + 1;
            }
            local_3a0[2] = local_3a0[2] + 1;
          }
          local_368 = local_368 + 1;
        }
        local_3d8[1] = 0;
        local_3d8[0] = -local_28;
        psVar11 = (size_t *)std::max<long>(local_3d8 + 1,local_3d8);
        local_3d8[2] = *psVar11;
        local_3f0[1] = 0;
        local_3f0[0] = -local_28;
        plVar10 = std::max<long>(local_3f0 + 1,local_3f0);
        for (local_3f0[2] = *plVar10;
            local_3f0[2] < in_stack_00000008 &&
            (local_28 + local_3f0[2]) * (long)local_1c < local_58; local_3f0[2] = local_3f0[2] + 1)
        {
          piVar9 = std::valarray<int>::operator[](&local_338,local_3d8[2]);
          if (0 < *piVar9) {
            this_00 = local_10;
            i_00 = local_3f0[2];
            k_00 = local_358[2];
            piVar9 = std::valarray<int>::operator[](&local_320,local_3d8[2]);
            iVar12 = *piVar9;
            piVar9 = std::valarray<int>::operator[](&local_338,local_3d8[2]);
            Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::set
                      (this_00,i_00,k_00,0,(ushort)(iVar12 / *piVar9) & 0xff);
          }
          local_3d8[2] = local_3d8[2] + 1;
        }
      }
      std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffa40);
      std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffffa40);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_310);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void RAWImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, 1);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(filename.c_str(), std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU8::work_t> vline(0, w);
        std::valarray<int> nline(0, w);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x);

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                ImageU16::store_t v;

                if (msbfirst)
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                }
                else
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
                }

                if (image.isValidS(v))
                {
                  vline[j]+=v;
                  nline[j]++;
                }
              }

              j++;
            }
          }

          // store line into image

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
      else // load whole image
      {
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            ImageU16::store_t v;

            if (msbfirst)
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
            }
            else
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
            }

            image.set(i, k, 0, v);
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}